

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextGLImpl.cpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextGLImpl::SetRenderTargetsExt
          (DeviceContextGLImpl *this,SetRenderTargetsAttribs *Attribs)

{
  bool bVar1;
  int iVar2;
  GLuint GVar3;
  RenderPassGLImpl *pRVar4;
  Char *pCVar5;
  ITexture *pIVar6;
  undefined4 extraout_var;
  TextureViewGLImpl *pTVar7;
  TextureBaseGL *pTVar8;
  GLTextureObj *pGVar9;
  char (*in_R8) [235];
  undefined1 local_68 [8];
  string msg_1;
  undefined1 local_38 [8];
  string msg;
  SetRenderTargetsAttribs *Attribs_local;
  DeviceContextGLImpl *this_local;
  
  msg.field_2._8_8_ = Attribs;
  pRVar4 = Diligent::RefCntAutoPtr::operator_cast_to_RenderPassGLImpl_
                     ((RefCntAutoPtr *)
                      &(this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).
                       m_pActiveRenderPass);
  if (pRVar4 != (RenderPassGLImpl *)0x0) {
    FormatString<char[89]>
              ((string *)local_38,
               (char (*) [89])
               "Calling SetRenderTargets inside active render pass is invalid. End the render pass first"
              );
    pCVar5 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar5,"SetRenderTargetsExt",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
               ,0x1aa);
    std::__cxx11::string::~string((string *)local_38);
  }
  bVar1 = DeviceContextBase<Diligent::EngineGLImplTraits>::SetRenderTargets
                    (&this->super_DeviceContextBase<Diligent::EngineGLImplTraits>,
                     (SetRenderTargetsAttribs *)msg.field_2._8_8_);
  if (!bVar1) {
    return;
  }
  if (((this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_NumBoundRenderTargets == 1)
     && (bVar1 = Diligent::RefCntAutoPtr::operator_cast_to_bool
                           ((RefCntAutoPtr *)
                            (this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).
                            m_pBoundRenderTargets), bVar1)) {
    pTVar7 = RefCntAutoPtr<Diligent::TextureViewGLImpl>::operator->
                       ((this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).
                        m_pBoundRenderTargets);
    pTVar8 = TextureViewBase<Diligent::EngineGLImplTraits>::GetTexture<Diligent::TextureBaseGL>
                       (&pTVar7->super_TextureViewBase<Diligent::EngineGLImplTraits>);
    pGVar9 = TextureBaseGL::GetGLHandle(pTVar8);
    GVar3 = GLObjectWrappers::GLObjWrapper::operator_cast_to_unsigned_int((GLObjWrapper *)pGVar9);
    if (GVar3 == 0) {
      bVar1 = RefCntAutoPtr<Diligent::TextureViewGLImpl>::operator!
                        (&(this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).
                          m_pBoundDepthStencil);
      if (!bVar1) {
        pTVar7 = RefCntAutoPtr<Diligent::TextureViewGLImpl>::operator->
                           (&(this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).
                             m_pBoundDepthStencil);
        pTVar8 = TextureViewBase<Diligent::EngineGLImplTraits>::GetTexture<Diligent::TextureBaseGL>
                           (&pTVar7->super_TextureViewBase<Diligent::EngineGLImplTraits>);
        pGVar9 = TextureBaseGL::GetGLHandle(pTVar8);
        GVar3 = GLObjectWrappers::GLObjWrapper::operator_cast_to_unsigned_int
                          ((GLObjWrapper *)pGVar9);
        if (GVar3 != 0) {
          pTVar7 = RefCntAutoPtr<Diligent::TextureViewGLImpl>::operator->
                             (&(this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).
                               m_pBoundDepthStencil);
          pIVar6 = TextureViewBase<Diligent::EngineGLImplTraits>::GetTexture
                             (&pTVar7->super_TextureViewBase<Diligent::EngineGLImplTraits>);
          iVar2 = (*(pIVar6->super_IDeviceObject).super_IObject._vptr_IObject[4])();
          FormatString<char[29],char_const*,char[235]>
                    ((string *)local_68,(Diligent *)"Attempting to bind texture \'",
                     (char (*) [29])CONCAT44(extraout_var,iVar2),
                     (char **)
                     "\' as depth buffer with the default framebuffer\'s color buffer: color buffer of the default framebuffer can only be bound with the default framebuffer\'s depth buffer and cannot be combined with any other depth buffer in OpenGL backend."
                     ,in_R8);
          pCVar5 = (Char *)std::__cxx11::string::c_str();
          DebugAssertionFailed
                    (pCVar5,"SetRenderTargetsExt",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
                     ,0x1b3);
          std::__cxx11::string::~string((string *)local_68);
        }
      }
      this->m_IsDefaultFBOBound = true;
      goto LAB_004c7ee8;
    }
  }
  if (((this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_NumBoundRenderTargets == 0)
     && (bVar1 = Diligent::RefCntAutoPtr::operator_cast_to_bool
                           ((RefCntAutoPtr *)
                            &(this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).
                             m_pBoundDepthStencil), bVar1)) {
    pTVar7 = RefCntAutoPtr<Diligent::TextureViewGLImpl>::operator->
                       (&(this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).
                         m_pBoundDepthStencil);
    pTVar8 = TextureViewBase<Diligent::EngineGLImplTraits>::GetTexture<Diligent::TextureBaseGL>
                       (&pTVar7->super_TextureViewBase<Diligent::EngineGLImplTraits>);
    pGVar9 = TextureBaseGL::GetGLHandle(pTVar8);
    GVar3 = GLObjectWrappers::GLObjWrapper::operator_cast_to_unsigned_int((GLObjWrapper *)pGVar9);
    if (GVar3 == 0) {
      this->m_IsDefaultFBOBound = true;
      goto LAB_004c7ee8;
    }
  }
  this->m_IsDefaultFBOBound = false;
LAB_004c7ee8:
  CommitRenderTargets(this);
  return;
}

Assistant:

void DeviceContextGLImpl::SetRenderTargetsExt(const SetRenderTargetsAttribs& Attribs)
{
    DEV_CHECK_ERR(m_pActiveRenderPass == nullptr, "Calling SetRenderTargets inside active render pass is invalid. End the render pass first");

    if (TDeviceContextBase::SetRenderTargets(Attribs))
    {
        if (m_NumBoundRenderTargets == 1 && m_pBoundRenderTargets[0] && m_pBoundRenderTargets[0]->GetTexture<TextureBaseGL>()->GetGLHandle() == 0)
        {
            DEV_CHECK_ERR(!m_pBoundDepthStencil || m_pBoundDepthStencil->GetTexture<TextureBaseGL>()->GetGLHandle() == 0,
                          "Attempting to bind texture '", m_pBoundDepthStencil->GetTexture()->GetDesc().Name,
                          "' as depth buffer with the default framebuffer's color buffer: color buffer of the default framebuffer "
                          "can only be bound with the default framebuffer's depth buffer and cannot be combined with any other depth buffer in OpenGL backend.");
            m_IsDefaultFBOBound = true;
        }
        else if (m_NumBoundRenderTargets == 0 && m_pBoundDepthStencil && m_pBoundDepthStencil->GetTexture<TextureBaseGL>()->GetGLHandle() == 0)
        {
            m_IsDefaultFBOBound = true;
        }
        else
        {
            m_IsDefaultFBOBound = false;
        }

        CommitRenderTargets();
    }
}